

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_utils.cc
# Opt level: O2

bool sptk::ComputePercentagePointOfStandardNormalDistribution
               (double probability,double *percentage_point)

{
  long lVar1;
  bool bVar2;
  double *pdVar3;
  double *pdVar4;
  int i;
  byte bVar5;
  ulong extraout_XMM0_Qb;
  double dVar6;
  initializer_list<double> __l;
  allocator_type local_b9;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_98;
  ulong uStack_90;
  vector<double,_std::allocator<double>_> parameters;
  double local_70 [11];
  
  bVar5 = 0;
  bVar2 = (bool)(percentage_point != (double *)0x0 & -(probability < 1.0 && 0.0 < probability));
  if (bVar2 == true) {
    if ((probability != 0.5) || (NAN(probability))) {
      local_a8 = probability;
      local_98 = log((1.0 - probability) * probability * 4.0);
      local_98 = -local_98;
      uStack_90 = extraout_XMM0_Qb ^ 0x8000000000000000;
      pdVar3 = (double *)&DAT_0010fac0;
      pdVar4 = local_70;
      for (lVar1 = 0xb; lVar1 != 0; lVar1 = lVar1 + -1) {
        *pdVar4 = *pdVar3;
        pdVar3 = pdVar3 + (ulong)bVar5 * -2 + 1;
        pdVar4 = pdVar4 + (ulong)bVar5 * -2 + 1;
      }
      __l._M_len = 0xb;
      __l._M_array = local_70;
      std::vector<double,_std::allocator<double>_>::vector(&parameters,__l,&local_b9);
      dVar6 = 0.0;
      for (lVar1 = 0;
          lVar1 < (int)((ulong)((long)parameters.super__Vector_base<double,_std::allocator<double>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)parameters.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start) >> 3);
          lVar1 = lVar1 + 1) {
        local_b8 = parameters.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar1];
        local_b0 = dVar6;
        dVar6 = pow(local_98,(double)(int)lVar1);
        dVar6 = local_b0 + dVar6 * local_b8;
      }
      dVar6 = dVar6 * local_98;
      if (dVar6 < 0.0) {
        dVar6 = sqrt(dVar6);
      }
      else {
        dVar6 = SQRT(dVar6);
      }
      *percentage_point =
           (double)(~-(ulong)(0.5 < local_a8) & (ulong)dVar6 |
                   (ulong)-dVar6 & -(ulong)(0.5 < local_a8));
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&parameters.super__Vector_base<double,_std::allocator<double>_>);
    }
    else {
      *percentage_point = 0.0;
    }
  }
  return bVar2;
}

Assistant:

bool ComputePercentagePointOfStandardNormalDistribution(
    double probability, double* percentage_point) {
  if (probability <= 0.0 || 1.0 <= probability || NULL == percentage_point) {
    return false;
  }

  if (0.5 == probability) {
    *percentage_point = 0.0;
    return true;
  }

  const double y(-std::log(4.0 * probability * (1.0 - probability)));
  const std::vector<double> parameters{
      0.1570796288e+1,  0.3706987906e-1,  -0.8364353589e-3, -0.2250947176e-3,
      0.6841218299e-5,  0.5824238515e-5,  -0.1045274970e-5, 0.8360937017e-7,
      -0.3231081277e-8, 0.3657763036e-10, 0.6936233982e-12};

  double sum(0.0);
  for (int i(0); i < static_cast<int>(parameters.size()); ++i) {
    sum += parameters[i] * std::pow(y, i);
  }
  *percentage_point =
      (0.5 < probability) ? -std::sqrt(sum * y) : std::sqrt(sum * y);
  return true;
}